

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNsPtr xmlNewNs(xmlNodePtr node,xmlChar *href,xmlChar *prefix)

{
  xmlNs *pxVar1;
  int iVar2;
  xmlNsPtr cur;
  xmlChar *pxVar3;
  xmlNs *pxVar4;
  
  if ((node != (xmlNodePtr)0x0) && (node->type != XML_ELEMENT_NODE)) {
    return (xmlNsPtr)0x0;
  }
  cur = (xmlNsPtr)(*xmlMalloc)(0x30);
  if (cur == (xmlNsPtr)0x0) {
    return (xmlNsPtr)0x0;
  }
  cur->next = (_xmlNs *)0x0;
  *(undefined8 *)&cur->type = 0;
  cur->_private = (void *)0x0;
  cur->context = (_xmlDoc *)0x0;
  cur->href = (xmlChar *)0x0;
  cur->prefix = (xmlChar *)0x0;
  cur->type = XML_NAMESPACE_DECL;
  if (href != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(href);
    cur->href = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) goto LAB_00148a93;
  }
  if (prefix != (xmlChar *)0x0) {
    pxVar3 = xmlStrdup(prefix);
    cur->prefix = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) goto LAB_00148a93;
  }
  if (node == (xmlNodePtr)0x0) {
    return cur;
  }
  pxVar1 = node->nsDef;
  if (pxVar1 == (xmlNs *)0x0) {
    node->nsDef = cur;
    return cur;
  }
  iVar2 = xmlStrEqual(pxVar1->prefix,cur->prefix);
  pxVar4 = pxVar1;
  if (iVar2 == 0) goto LAB_00148aca;
  pxVar3 = pxVar1->href;
  while (pxVar4 = pxVar1, pxVar3 == (xmlChar *)0x0) {
LAB_00148aca:
    do {
      pxVar1 = pxVar4->next;
      if (pxVar1 == (_xmlNs *)0x0) {
        pxVar4->next = cur;
        return cur;
      }
      iVar2 = xmlStrEqual(pxVar1->prefix,cur->prefix);
      pxVar4 = pxVar1;
    } while (iVar2 == 0);
    pxVar3 = pxVar1->href;
  }
LAB_00148a93:
  xmlFreeNs(cur);
  return (xmlNsPtr)0x0;
}

Assistant:

xmlNsPtr
xmlNewNs(xmlNodePtr node, const xmlChar *href, const xmlChar *prefix) {
    xmlNsPtr cur;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE))
	return(NULL);

    /*
     * Allocate a new Namespace and fill the fields.
     */
    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlNs));
    cur->type = XML_LOCAL_NAMESPACE;

    if (href != NULL) {
	cur->href = xmlStrdup(href);
        if (cur->href == NULL)
            goto error;
    }
    if (prefix != NULL) {
	cur->prefix = xmlStrdup(prefix);
        if (cur->prefix == NULL)
            goto error;
    }

    /*
     * Add it at the end to preserve parsing order ...
     * and checks for existing use of the prefix
     */
    if (node != NULL) {
	if (node->nsDef == NULL) {
	    node->nsDef = cur;
	} else {
	    xmlNsPtr prev = node->nsDef;

	    if ((xmlStrEqual(prev->prefix, cur->prefix)) &&
                (prev->href != NULL))
                goto error;
	    while (prev->next != NULL) {
	        prev = prev->next;
		if ((xmlStrEqual(prev->prefix, cur->prefix)) &&
                    (prev->href != NULL))
                    goto error;
	    }
	    prev->next = cur;
	}
    }
    return(cur);

error:
    xmlFreeNs(cur);
    return(NULL);
}